

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pushOntoSorter(Parse *pParse,ExprList *pOrderBy,Select *pSelect,int regData)

{
  int iVar1;
  int iVar2;
  Vdbe *p;
  int target;
  int p3;
  uint uVar3;
  uint uVar4;
  
  p = pParse->pVdbe;
  iVar2 = pOrderBy->nExpr;
  iVar1 = iVar2 + 2;
  target = sqlite3GetTempRange(pParse,iVar1);
  p3 = sqlite3GetTempReg(pParse);
  sqlite3ExprCacheClear(pParse);
  sqlite3ExprCodeExprList(pParse,pOrderBy,target,0);
  sqlite3VdbeAddOp2(p,0x37,pOrderBy->iECursor,target + iVar2);
  sqlite3ExprCodeMove(pParse,regData,target + 1 + iVar2,1);
  sqlite3VdbeAddOp3(p,0x1f,target,iVar1,p3);
  sqlite3VdbeAddOp2(p,((pSelect->selFlags & 0x40) == 0) + 0x60,pOrderBy->iECursor,p3);
  sqlite3ReleaseTempReg(pParse,p3);
  sqlite3ReleaseTempRange(pParse,target,iVar1);
  if (pSelect->iLimit != 0) {
    iVar1 = pSelect->iOffset + 1;
    if (pSelect->iOffset == 0) {
      iVar1 = pSelect->iLimit;
    }
    uVar3 = sqlite3VdbeAddOp1(p,0x7a,iVar1);
    sqlite3VdbeAddOp2(p,0x14,iVar1,-1);
    uVar4 = sqlite3VdbeAddOp0(p,1);
    if ((-1 < (int)uVar3) && (uVar3 < (uint)p->nOp)) {
      p->aOp[uVar3].p2 = p->nOp;
    }
    sqlite3VdbeAddOp1(p,0x43,pOrderBy->iECursor);
    sqlite3VdbeAddOp1(p,0x3b,pOrderBy->iECursor);
    if ((-1 < (int)uVar4) && (uVar4 < (uint)p->nOp)) {
      p->aOp[uVar4].p2 = p->nOp;
    }
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  ExprList *pOrderBy,    /* The ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData            /* Register holding data to be sorted */
){
  Vdbe *v = pParse->pVdbe;
  int nExpr = pOrderBy->nExpr;
  int regBase = sqlite3GetTempRange(pParse, nExpr+2);
  int regRecord = sqlite3GetTempReg(pParse);
  int op;
  sqlite3ExprCacheClear(pParse);
  sqlite3ExprCodeExprList(pParse, pOrderBy, regBase, 0);
  sqlite3VdbeAddOp2(v, OP_Sequence, pOrderBy->iECursor, regBase+nExpr);
  sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+1, 1);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nExpr + 2, regRecord);
  if( pSelect->selFlags & SF_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp2(v, op, pOrderBy->iECursor, regRecord);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3ReleaseTempRange(pParse, regBase, nExpr+2);
  if( pSelect->iLimit ){
    int addr1, addr2;
    int iLimit;
    if( pSelect->iOffset ){
      iLimit = pSelect->iOffset+1;
    }else{
      iLimit = pSelect->iLimit;
    }
    addr1 = sqlite3VdbeAddOp1(v, OP_IfZero, iLimit);
    sqlite3VdbeAddOp2(v, OP_AddImm, iLimit, -1);
    addr2 = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp1(v, OP_Last, pOrderBy->iECursor);
    sqlite3VdbeAddOp1(v, OP_Delete, pOrderBy->iECursor);
    sqlite3VdbeJumpHere(v, addr2);
  }
}